

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void TableSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  int iVar1;
  long in_RDI;
  ImGuiTable *table;
  int i;
  ImGuiContext *g;
  int n;
  ImGuiTable *in_stack_ffffffffffffffd8;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    n = local_1c;
    iVar1 = ImPool<ImGuiTable>::GetMapSize((ImPool<ImGuiTable> *)(in_RDI + 0x4ea8));
    if (n == iVar1) break;
    in_stack_ffffffffffffffd8 =
         ImPool<ImGuiTable>::TryGetMapData((ImPool<ImGuiTable> *)in_stack_ffffffffffffffd8,n);
    if (in_stack_ffffffffffffffd8 != (ImGuiTable *)0x0) {
      in_stack_ffffffffffffffd8->IsSettingsRequestLoad = true;
      in_stack_ffffffffffffffd8->SettingsOffset = -1;
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

static void TableSettingsHandler_ApplyAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetMapSize(); i++)
        if (ImGuiTable* table = g.Tables.TryGetMapData(i))
        {
            table->IsSettingsRequestLoad = true;
            table->SettingsOffset = -1;
        }
}